

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::If::If(If *this,Id cond,uint ctrl,Builder *gb)

{
  Function *parent;
  Builder *pBVar1;
  Block *pBVar2;
  Id IVar3;
  
  this->builder = gb;
  this->condition = cond;
  this->control = ctrl;
  this->elseBlock = (Block *)0x0;
  parent = gb->buildPoint->parent;
  this->function = parent;
  pBVar2 = (Block *)::operator_new(0x90);
  IVar3 = gb->uniqueId + 1;
  gb->uniqueId = IVar3;
  Block::Block(pBVar2,IVar3,parent);
  this->thenBlock = pBVar2;
  pBVar2 = (Block *)::operator_new(0x90);
  IVar3 = this->builder->uniqueId + 1;
  this->builder->uniqueId = IVar3;
  Block::Block(pBVar2,IVar3,this->function);
  this->mergeBlock = pBVar2;
  this->headerBlock = this->builder->buildPoint;
  createSelectionMerge(this->builder,pBVar2,this->control);
  spv::Function::addBlock(this->function,this->thenBlock);
  pBVar1 = this->builder;
  pBVar1->buildPoint = this->thenBlock;
  pBVar1->dirtyLineTracker = true;
  pBVar1->dirtyScopeTracker = true;
  return;
}

Assistant:

Builder::If::If(Id cond, unsigned int ctrl, Builder& gb) :
    builder(gb),
    condition(cond),
    control(ctrl),
    elseBlock(nullptr)
{
    function = &builder.getBuildPoint()->getParent();

    // make the blocks, but only put the then-block into the function,
    // the else-block and merge-block will be added later, in order, after
    // earlier code is emitted
    thenBlock = new Block(builder.getUniqueId(), *function);
    mergeBlock = new Block(builder.getUniqueId(), *function);

    // Save the current block, so that we can add in the flow control split when
    // makeEndIf is called.
    headerBlock = builder.getBuildPoint();
    builder.createSelectionMerge(mergeBlock, control);

    function->addBlock(thenBlock);
    builder.setBuildPoint(thenBlock);
}